

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_alloc.c
# Opt level: O2

size_t release_unused_segments(mstate m)

{
  tbinptr pmVar1;
  int iVar2;
  char *__addr;
  size_t __len;
  malloc_segment *pmVar3;
  malloc_tree_chunk *pmVar4;
  bindex_t bVar5;
  uint uVar6;
  long lVar7;
  tbinptr pmVar8;
  malloc_tree_chunk **ppmVar9;
  int iVar10;
  uint uVar11;
  int *piVar12;
  malloc_tree_chunk *pmVar13;
  size_t sVar14;
  ulong uVar15;
  size_t sVar16;
  tbinptr pmVar17;
  long lVar18;
  ulong uVar19;
  byte bVar20;
  malloc_segment *pmVar21;
  malloc_tree_chunk **ppmVar22;
  ulong uVar23;
  malloc_segment *local_70;
  
  uVar23 = 0;
  sVar16 = 0;
  pmVar3 = (m->seg).next;
  pmVar21 = &m->seg;
LAB_0013c524:
  do {
    do {
      local_70 = pmVar21;
      pmVar21 = pmVar3;
      if (pmVar21 == (malloc_segment *)0x0) {
        sVar14 = 0xff;
        if (0xff < uVar23) {
          sVar14 = uVar23;
        }
        m->release_checks = sVar14;
        return sVar16;
      }
      __addr = pmVar21->base;
      __len = pmVar21->size;
      pmVar3 = pmVar21->next;
      uVar23 = uVar23 + 1;
      uVar15 = (ulong)(-(int)__addr - 0x10U & 7);
      pmVar1 = (tbinptr)(__addr + uVar15);
      uVar15 = *(ulong *)(__addr + uVar15 + 8);
      uVar19 = uVar15 & 0xfffffffffffffffc;
    } while (((uVar15 & 2) != 0) ||
            ((char *)((long)pmVar1->child + (uVar19 - 0x20)) < __addr + (__len - 0x40)));
    if (pmVar1 == (tbinptr)m->dv) {
      m->dv = (mchunkptr)0x0;
      m->dvsize = 0;
    }
    else {
      pmVar17 = pmVar1->bk;
      pmVar4 = pmVar1->child[2];
      if (pmVar17 == pmVar1) {
        if (pmVar1->child[1] == (tbinptr)0x0) {
          if (pmVar1->child[0] == (tbinptr)0x0) {
            pmVar17 = (tbinptr)0x0;
            goto LAB_0013c604;
          }
          pmVar8 = pmVar1->child[0];
          ppmVar9 = pmVar1->child;
        }
        else {
          pmVar8 = pmVar1->child[1];
          ppmVar9 = pmVar1->child + 1;
        }
        do {
          do {
            ppmVar22 = ppmVar9;
            pmVar17 = pmVar8;
            pmVar8 = pmVar17->child[1];
            ppmVar9 = pmVar17->child + 1;
          } while (pmVar17->child[1] != (malloc_tree_chunk *)0x0);
          pmVar8 = pmVar17->child[0];
          ppmVar9 = pmVar17->child;
        } while (pmVar17->child[0] != (malloc_tree_chunk *)0x0);
        *ppmVar22 = (malloc_tree_chunk *)0x0;
      }
      else {
        pmVar13 = pmVar1->fd;
        pmVar13->bk = pmVar17;
        pmVar17->fd = pmVar13;
      }
LAB_0013c604:
      if (pmVar4 != (malloc_tree_chunk *)0x0) {
        bVar5 = (bindex_t)pmVar1->child[3];
        if (pmVar1 == m->treebins[bVar5]) {
          m->treebins[bVar5] = pmVar17;
          if (pmVar17 != (tbinptr)0x0) goto LAB_0013c636;
          bVar20 = (byte)bVar5 & 0x1f;
          m->treemap = m->treemap & (-2 << bVar20 | 0xfffffffeU >> 0x20 - bVar20);
        }
        else {
          pmVar4->child[pmVar4->child[0] != pmVar1] = pmVar17;
          if (pmVar17 != (tbinptr)0x0) {
LAB_0013c636:
            pmVar17->child[2] = pmVar4;
            pmVar4 = pmVar1->child[0];
            if (pmVar4 != (malloc_tree_chunk *)0x0) {
              pmVar17->child[0] = pmVar4;
              pmVar4->parent = pmVar17;
            }
            pmVar4 = pmVar1->child[1];
            if (pmVar4 != (malloc_tree_chunk *)0x0) {
              pmVar17->child[1] = pmVar4;
              pmVar4->parent = pmVar17;
            }
          }
        }
      }
    }
    piVar12 = __errno_location();
    iVar2 = *piVar12;
    iVar10 = munmap(__addr,__len);
    *piVar12 = iVar2;
    if (iVar10 == 0) {
      sVar16 = sVar16 + __len;
      local_70->next = pmVar3;
      pmVar21 = local_70;
    }
    else {
      uVar11 = (uint)(uVar15 >> 8);
      if (uVar11 == 0) {
        uVar15 = 0;
      }
      else {
        uVar15 = 0x1f;
        if (uVar11 < 0x10000) {
          uVar6 = 0x1f;
          if (uVar11 != 0) {
            for (; uVar11 >> uVar6 == 0; uVar6 = uVar6 - 1) {
            }
          }
          uVar15 = (ulong)((uVar19 >> ((ulong)(byte)(0x26 - (char)(uVar6 ^ 0x1f)) & 0x3f) & 1) != 0)
                   | (ulong)((uVar6 ^ 0x1f) * 2 ^ 0x3e);
        }
      }
      pmVar4 = (malloc_tree_chunk *)(m->treebins + uVar15);
      pmVar1->child[3] = (malloc_tree_chunk *)uVar15;
      pmVar1->child[0] = (malloc_tree_chunk *)0x0;
      pmVar1->child[1] = (malloc_tree_chunk *)0x0;
      if ((m->treemap >> ((uint)uVar15 & 0x1f) & 1) == 0) {
        m->treemap = m->treemap | 1 << ((byte)uVar15 & 0x1f);
        pmVar4->prev_foot = (size_t)pmVar1;
        pmVar1->child[2] = pmVar4;
      }
      else {
        bVar20 = 0x39 - (char)(uVar15 >> 1);
        if (uVar15 == 0x1f) {
          bVar20 = 0;
        }
        lVar18 = uVar19 << (bVar20 & 0x3f);
        pmVar4 = (malloc_tree_chunk *)pmVar4->prev_foot;
        do {
          pmVar13 = pmVar4;
          if ((pmVar13->head & 0xfffffffffffffffc) == uVar19) {
            pmVar4 = pmVar13->fd;
            pmVar4->bk = pmVar1;
            pmVar13->fd = pmVar1;
            pmVar1->fd = pmVar4;
            pmVar1->bk = pmVar13;
            pmVar1->child[2] = (malloc_tree_chunk *)0x0;
            goto LAB_0013c524;
          }
          lVar7 = lVar18 >> 0x3f;
          lVar18 = lVar18 * 2;
          pmVar4 = *(malloc_tree_chunk **)((long)pmVar13 + lVar7 * -8 + 0x20);
        } while (pmVar4 != (malloc_tree_chunk *)0x0);
        *(tbinptr *)((long)pmVar13 + lVar7 * -8 + 0x20) = pmVar1;
        pmVar1->child[2] = pmVar13;
      }
      pmVar1->bk = pmVar1;
      pmVar1->fd = pmVar1;
    }
  } while( true );
}

Assistant:

static size_t release_unused_segments(mstate m)
{
  size_t released = 0;
  size_t nsegs = 0;
  msegmentptr pred = &m->seg;
  msegmentptr sp = pred->next;
  while (sp != 0) {
    char *base = sp->base;
    size_t size = sp->size;
    msegmentptr next = sp->next;
    nsegs++;
    {
      mchunkptr p = align_as_chunk(base);
      size_t psize = chunksize(p);
      /* Can unmap if first chunk holds entire segment and not pinned */
      if (!cinuse(p) && (char *)p + psize >= base + size - TOP_FOOT_SIZE) {
	tchunkptr tp = (tchunkptr)p;
	if (p == m->dv) {
	  m->dv = 0;
	  m->dvsize = 0;
	} else {
	  unlink_large_chunk(m, tp);
	}
	if (CALL_MUNMAP(base, size) == 0) {
	  released += size;
	  /* unlink obsoleted record */
	  sp = pred;
	  sp->next = next;
	} else { /* back out if cannot unmap */
	  insert_large_chunk(m, tp, psize);
	}
      }
    }
    pred = sp;
    sp = next;
  }
  /* Reset check counter */
  m->release_checks = nsegs > MAX_RELEASE_CHECK_RATE ?
		      nsegs : MAX_RELEASE_CHECK_RATE;
  return released;
}